

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest18_19::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest18_19 *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400\n\nsubroutine bool bool_processor();\nsubroutine vec4 vec4_processor(in vec4 iparam);\n\nsubroutine(bool_processor) bool returnsFalse()\n{\n    return false;\n}\n\nsubroutine(bool_processor) bool returnsTrue()\n{\n    return true;\n}\n\nsubroutine(vec4_processor) vec4 divideByTwo(in vec4 iparam)\n{\n    return iparam * vec4(0.5);\n}\n\nsubroutine(vec4_processor) vec4 multiplyByFour(in vec4 iparam)\n{\n    return iparam * vec4(4.0);\n}\n\nsubroutine uniform bool_processor bool_operator1;\nsubroutine uniform bool_processor bool_operator2;\nsubroutine uniform vec4_processor vec4_operator1;\nsubroutine uniform vec4_processor vec4_operator2;\n\nout float result;\n\nvoid main()\n{\n    if (bool_operator1() )\n    {\n        float value = float( (3 * gl_VertexID + 1) * 2);\n\n        while (bool_operator1() )\n        {\n            value /= float(gl_VertexID + 2);\n\n            if (value <= 1.0f) break;\n        }\n\n        result = value;\n    }\n    else\n    {\n        vec4 value = vec4(gl_VertexID,     gl_VertexID + 1,\n                          gl_VertexID + 2, gl_VertexID + 3);\n\n        switch (gl_VertexID % 2)\n        {\n            case 0:\n            {\n                for (int iteration = 0; iteration < gl_VertexID && bool_operator2(); ++iteration)\n                {\n                    value = vec4_operator2(vec4_operator1(value));\n                }\n\n                break;\n            }\n\n            case 1:\n            {\n                for (int iteration = 0; iteration < gl_VertexID * 2; ++iteration)\n                {\n                    value = vec4_operator1(vec4_operator2(value));\n                }\n\n                break;\n            }\n        }\n\n        result = value.x + value.y + value.z + value.w;\n\n    }\n}\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest18_19::getVertexShaderBody() const
{
	return "#version 400\n"
		   "\n"
		   "subroutine bool bool_processor();\n"
		   "subroutine vec4 vec4_processor(in vec4 iparam);\n"
		   "\n"
		   "subroutine(bool_processor) bool returnsFalse()\n"
		   "{\n"
		   "    return false;\n"
		   "}\n"
		   "\n"
		   "subroutine(bool_processor) bool returnsTrue()\n"
		   "{\n"
		   "    return true;\n"
		   "}\n"
		   "\n"
		   "subroutine(vec4_processor) vec4 divideByTwo(in vec4 iparam)\n"
		   "{\n"
		   "    return iparam * vec4(0.5);\n"
		   "}\n"
		   "\n"
		   "subroutine(vec4_processor) vec4 multiplyByFour(in vec4 iparam)\n"
		   "{\n"
		   "    return iparam * vec4(4.0);\n"
		   "}\n"
		   "\n"
		   "subroutine uniform bool_processor bool_operator1;\n"
		   "subroutine uniform bool_processor bool_operator2;\n"
		   "subroutine uniform vec4_processor vec4_operator1;\n"
		   "subroutine uniform vec4_processor vec4_operator2;\n"
		   "\n"
		   "out float result;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    if (bool_operator1() )\n"
		   "    {\n"
		   "        float value = float( (3 * gl_VertexID + 1) * 2);\n"
		   "\n"
		   "        while (bool_operator1() )\n"
		   "        {\n"
		   "            value /= float(gl_VertexID + 2);\n"
		   "\n"
		   "            if (value <= 1.0f) break;\n"
		   "        }\n"
		   "\n"
		   "        result = value;\n"
		   "    }\n"
		   "    else\n"
		   "    {\n"
		   "        vec4 value = vec4(gl_VertexID,     gl_VertexID + 1,\n"
		   "                          gl_VertexID + 2, gl_VertexID + 3);\n"
		   "\n"
		   "        switch (gl_VertexID % 2)\n"
		   "        {\n"
		   "            case 0:\n"
		   "            {\n"
		   "                for (int iteration = 0; iteration < gl_VertexID && bool_operator2(); ++iteration)\n"
		   "                {\n"
		   "                    value = vec4_operator2(vec4_operator1(value));\n"
		   "                }\n"
		   "\n"
		   "                break;\n"
		   "            }\n"
		   "\n"
		   "            case 1:\n"
		   "            {\n"
		   "                for (int iteration = 0; iteration < gl_VertexID * 2; ++iteration)\n"
		   "                {\n"
		   "                    value = vec4_operator1(vec4_operator2(value));\n"
		   "                }\n"
		   "\n"
		   "                break;\n"
		   "            }\n"
		   "        }\n"
		   "\n"
		   "        result = value.x + value.y + value.z + value.w;\n"
		   "\n"
		   "    }\n"
		   "}\n";
}